

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall cmTestGenerator::GenerateInternalProperties(cmTestGenerator *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ostream *poVar4;
  cmListFileContext *pcVar5;
  cmListFileBacktrace bt;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var3 = (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
           cmTest::GetBacktrace(this->Test);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,p_Var3);
  bVar1 = cmListFileBacktrace::Empty((cmListFileBacktrace *)&local_50);
  if (!bVar1) {
    poVar4 = std::operator<<(os," ");
    poVar4 = std::operator<<(poVar4,"_BACKTRACE_TRIPLES");
    std::operator<<(poVar4," \"");
    bVar1 = false;
    while( true ) {
      bVar2 = cmListFileBacktrace::Empty((cmListFileBacktrace *)&local_50);
      if (bVar2) break;
      pcVar5 = cmListFileBacktrace::Top((cmListFileBacktrace *)&local_50);
      if (bVar1) {
        std::operator<<(os,";");
      }
      poVar4 = std::operator<<(os,(string *)&pcVar5->FilePath);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)pcVar5);
      cmListFileBacktrace::Pop((cmListFileBacktrace *)&local_40);
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_50,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      bVar1 = true;
    }
    std::operator<<(os,"\"");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void cmTestGenerator::GenerateInternalProperties(std::ostream& os)
{
  cmListFileBacktrace bt = this->Test->GetBacktrace();
  if (bt.Empty()) {
    return;
  }

  os << " "
     << "_BACKTRACE_TRIPLES"
     << " \"";

  bool prependTripleSeparator = false;
  while (!bt.Empty()) {
    const auto& entry = bt.Top();
    if (prependTripleSeparator) {
      os << ";";
    }
    os << entry.FilePath << ";" << entry.Line << ";" << entry.Name;
    bt = bt.Pop();
    prependTripleSeparator = true;
  }

  os << "\"";
}